

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall
HashCallback<Blob<128>_>::operator()(HashCallback<Blob<128>_> *this,void *key,int len)

{
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *this_00;
  pointer pBVar1;
  size_t i;
  long lVar2;
  Blob<128> h;
  uint8_t local_38 [24];
  
  this_00 = this->m_hashes;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            (this_00,((long)(this_00->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  lVar2 = 0;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  (*this->m_pfHash)(key,len,0,local_38);
  pBVar1 = (this->m_hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pBVar1[-1].bytes[lVar2] = local_38[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);
    m_hashes.back() = h;
  }